

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d.c
# Opt level: O3

void envy_bios_print_bit_d(envy_bios *bios,FILE *out,uint mask)

{
  ushort uVar1;
  uint uVar2;
  envy_bios_bit_entry *peVar3;
  ulong uVar4;
  uint idx;
  char *name;
  envy_bios_bit_entry *local_38;
  
  local_38 = (bios->d).bit;
  if ((mask >> 0x18 & 1) != 0 && local_38 != (envy_bios_bit_entry *)0x0) {
    fprintf((FILE *)out,"BIT table \'d\' at 0x%x, version %i\n",(ulong)local_38->offset,
            (ulong)local_38->version);
    peVar3 = (bios->d).bit;
    if (peVar3->t_len != 0) {
      uVar4 = 0;
      idx = 0;
      do {
        uVar1 = peVar3->t_offset;
        uVar2 = (uint)uVar1 + (int)uVar4 + 1;
        if (uVar2 < bios->length) {
          uVar2 = (uint)CONCAT11(bios->data[uVar2],bios->data[uVar4 + uVar1]);
          if (uVar2 != 0) {
            parse_at(bios,idx,(char **)&local_38);
            fprintf((FILE *)out,"0x%02x: 0x%x => d %s\n",uVar4 & 0xffffffff,(ulong)uVar2,local_38);
          }
        }
        else {
          fprintf(_stderr,"requested OOB u16 at 0x%04x\n",uVar1 + uVar4);
        }
        idx = idx + 1;
        peVar3 = (bios->d).bit;
        uVar4 = uVar4 + 2;
      } while ((uint)uVar4 < (uint)peVar3->t_len);
    }
    fputc(10,(FILE *)out);
  }
  return;
}

Assistant:

void
envy_bios_print_bit_d(struct envy_bios *bios, FILE *out, unsigned mask)
{
	struct envy_bios_d *d = &bios->d;
	uint16_t addr;
	int ret = 0, i = 0;

	if (!d->bit || !(mask & ENVY_BIOS_PRINT_d))
		return;

	fprintf(out, "BIT table 'd' at 0x%x, version %i\n",
		d->bit->offset, d->bit->version);

	for (i = 0; i * 2 < d->bit->t_len; ++i) {
		ret = bios_u16(bios, d->bit->t_offset + (i * 2), &addr);
		if (!ret && addr) {
			const char *name;
			ret = parse_at(bios, i, &name);
			fprintf(out, "0x%02x: 0x%x => d %s\n", i * 2, addr, name);
		}
	}

	fprintf(out, "\n");
}